

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

int __thiscall QDockAreaLayoutInfo::remove(QDockAreaLayoutInfo *this,char *__filename)

{
  bool bVar1;
  long in_FS_OFFSET;
  QList<int> path;
  undefined1 *local_20;
  undefined1 *local_18;
  QDockAreaLayoutInfo *this_00;
  
  this_00 = *(QDockAreaLayoutInfo **)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  indexOf(this_00,(QWidget *)&DAT_aaaaaaaaaaaaaaaa);
  bVar1 = QList<int>::isEmpty((QList<int> *)0x5708a7);
  if (!bVar1) {
    remove(this,(char *)&local_20);
  }
  QList<int>::~QList((QList<int> *)0x5708d8);
  if (*(QDockAreaLayoutInfo **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return (int)*(QDockAreaLayoutInfo **)(in_FS_OFFSET + 0x28);
}

Assistant:

void QDockAreaLayoutInfo::remove(QWidget *widget)
{
    const QList<int> path = indexOf(widget);
    if (path.isEmpty())
        return;
    remove(path);
}